

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-inl.h
# Opt level: O2

Promise<void> __thiscall
kj::Promise<void>::attach<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>
          (Promise<void> *this,Own<kj::WebSocket> *attachments,Own<kj::WebSocket> *attachments_1)

{
  AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_> *pAVar1;
  Own<kj::WebSocket> *in_RCX;
  PromiseNode *extraout_RDX;
  Promise<void> PVar2;
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_>_>
  local_58;
  TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_> local_48;
  Own<kj::_::PromiseNode> local_28;
  
  tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>
            ((ExpandAndApplyResult<kj::_::MakeTupleFunc,_kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>
              *)&local_48,(kj *)attachments_1,in_RCX,in_RCX);
  heap<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>>,kj::Own<kj::_::PromiseNode>,kj::_::Tuple<kj::Own<kj::WebSocket>,kj::Own<kj::WebSocket>>>
            ((kj *)&local_58,(Own<kj::_::PromiseNode> *)attachments,
             (Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_> *)&local_48);
  pAVar1 = local_58.ptr;
  local_28.disposer = local_58.disposer;
  local_58.ptr = (AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_>
                  *)0x0;
  (this->super_PromiseBase).node.disposer = local_58.disposer;
  (this->super_PromiseBase).node.ptr = (PromiseNode *)pAVar1;
  local_28.ptr = (PromiseNode *)0x0;
  Own<kj::_::PromiseNode>::dispose(&local_28);
  Own<kj::_::AttachmentPromiseNode<kj::_::Tuple<kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>_>_>
  ::dispose(&local_58);
  _::TupleImpl<kj::_::Indexes<0UL,_1UL>,_kj::Own<kj::WebSocket>,_kj::Own<kj::WebSocket>_>::
  ~TupleImpl(&local_48);
  PVar2.super_PromiseBase.node.ptr = extraout_RDX;
  PVar2.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar2.super_PromiseBase.node;
}

Assistant:

Promise<T> Promise<T>::attach(Attachments&&... attachments) {
  return Promise(false, kj::heap<_::AttachmentPromiseNode<Tuple<Attachments...>>>(
      kj::mv(node), kj::tuple(kj::fwd<Attachments>(attachments)...)));
}